

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reporter.cc
# Opt level: O0

bool __thiscall benchmark::JSONReporter::ReportContext(JSONReporter *this,Context *context)

{
  ostream *poVar1;
  long in_RSI;
  BenchmarkReporter *in_RDI;
  char build_type [6];
  string walltime_value;
  string indent;
  string inner_indent;
  ostream *out;
  char *in_stack_fffffffffffffd60;
  string *in_stack_fffffffffffffd68;
  string *in_stack_fffffffffffffd70;
  allocator *paVar2;
  string *in_stack_fffffffffffffd78;
  allocator local_1f9;
  string local_1f8 [32];
  string local_1d8 [32];
  undefined4 local_1b8;
  undefined2 local_1b4;
  allocator local_1b1;
  string local_1b0 [32];
  string local_190 [39];
  allocator local_169;
  string local_168 [32];
  string local_148 [39];
  allocator local_121;
  string local_120 [32];
  string local_100 [16];
  int64_t in_stack_ffffffffffffff10;
  string *in_stack_ffffffffffffff18;
  allocator local_d9;
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [39];
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [32];
  ostream *local_18;
  long local_10;
  
  local_10 = in_RSI;
  local_18 = BenchmarkReporter::GetOutputStream(in_RDI);
  std::operator<<(local_18,"{\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,2,' ',&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  poVar1 = std::operator<<(local_18,local_38);
  std::operator<<(poVar1,"\"context\": {\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,4,' ',&local_71);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  LocalDateTimeString_abi_cxx11_();
  poVar1 = std::operator<<(local_18,local_70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d8,"date",&local_d9);
  anon_unknown_3::FormatKV(in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
  poVar1 = std::operator<<(poVar1,local_b8);
  std::operator<<(poVar1,",\n");
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  poVar1 = std::operator<<(local_18,local_70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_120,"num_cpus",&local_121);
  anon_unknown_3::FormatKV(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  poVar1 = std::operator<<(poVar1,local_100);
  std::operator<<(poVar1,",\n");
  std::__cxx11::string::~string(local_100);
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  poVar1 = std::operator<<(local_18,local_70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_168,"mhz_per_cpu",&local_169);
  anon_unknown_3::RoundDouble(*(double *)(local_10 + 8));
  anon_unknown_3::FormatKV(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  poVar1 = std::operator<<(poVar1,local_148);
  std::operator<<(poVar1,",\n");
  std::__cxx11::string::~string(local_148);
  std::__cxx11::string::~string(local_168);
  std::allocator<char>::~allocator((allocator<char> *)&local_169);
  poVar1 = std::operator<<(local_18,local_70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b0,"cpu_scaling_enabled",&local_1b1);
  anon_unknown_3::FormatKV
            (in_stack_fffffffffffffd68,SUB81((ulong)in_stack_fffffffffffffd60 >> 0x38,0));
  poVar1 = std::operator<<(poVar1,local_190);
  std::operator<<(poVar1,",\n");
  std::__cxx11::string::~string(local_190);
  std::__cxx11::string::~string(local_1b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
  local_1b4 = 0x67;
  local_1b8 = 0x75626564;
  poVar1 = std::operator<<(local_18,local_70);
  paVar2 = &local_1f9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f8,"library_build_type",paVar2);
  anon_unknown_3::FormatKV(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
  poVar1 = std::operator<<(poVar1,local_1d8);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string(local_1d8);
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  poVar1 = std::operator<<(local_18,local_38);
  std::operator<<(poVar1,"},\n");
  poVar1 = std::operator<<(local_18,local_38);
  std::operator<<(poVar1,"\"benchmarks\": [\n");
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_38);
  return true;
}

Assistant:

bool JSONReporter::ReportContext(const Context& context) {
  std::ostream& out = GetOutputStream();

  out << "{\n";
  std::string inner_indent(2, ' ');

  // Open context block and print context information.
  out << inner_indent << "\"context\": {\n";
  std::string indent(4, ' ');

  std::string walltime_value = LocalDateTimeString();
  out << indent << FormatKV("date", walltime_value) << ",\n";

  out << indent
      << FormatKV("num_cpus", static_cast<int64_t>(context.num_cpus))
      << ",\n";
  out << indent
      << FormatKV("mhz_per_cpu", RoundDouble(context.mhz_per_cpu))
      << ",\n";
  out << indent
      << FormatKV("cpu_scaling_enabled", context.cpu_scaling_enabled)
      << ",\n";

#if defined(NDEBUG)
  const char build_type[] = "release";
#else
  const char build_type[] = "debug";
#endif
  out << indent << FormatKV("library_build_type", build_type) << "\n";
  // Close context block and open the list of benchmarks.
  out << inner_indent << "},\n";
  out << inner_indent << "\"benchmarks\": [\n";
  return true;
}